

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

uint64_t __thiscall
libtorrent::aux::anon_unknown_119::last_optimistic_unchoke_cmp::get_ext_priority
          (last_optimistic_unchoke_cmp *this,opt_unchoke_candidate *peer)

{
  _Atomic_word *p_Var1;
  vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  *pvVar2;
  pointer psVar3;
  int iVar4;
  ulong uVar5;
  pointer *ppsVar6;
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  uVar5 = peer->ext_priority;
  if (uVar5 == 0xfffffffffffffffe) {
    peer->ext_priority = 0xffffffffffffffff;
    ppsVar6 = (pointer *)this->plugins;
    pvVar2 = this[1].plugins;
    if ((vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
         *)ppsVar6 == pvVar2) {
      uVar5 = 0xffffffffffffffff;
    }
    else {
      do {
        psVar3 = *ppsVar6;
        local_40 = (peer->peer->
                   super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_ptr;
        local_38 = (peer->peer->
                   super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_refcount._M_pi;
        if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_38->_M_weak_count = local_38->_M_weak_count + 1;
            UNLOCK();
          }
          else {
            local_38->_M_weak_count = local_38->_M_weak_count + 1;
          }
        }
        uVar5 = (*(code *)(psVar3->
                          super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                          [10]._vptr_plugin)(psVar3,&local_40);
        if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = &local_38->_M_weak_count;
            iVar4 = *p_Var1;
            *p_Var1 = *p_Var1 + -1;
            UNLOCK();
          }
          else {
            iVar4 = local_38->_M_weak_count;
            local_38->_M_weak_count = iVar4 + -1;
          }
          if (iVar4 == 1) {
            (*local_38->_vptr__Sp_counted_base[3])();
          }
        }
        if (peer->ext_priority < uVar5) {
          uVar5 = peer->ext_priority;
        }
        peer->ext_priority = uVar5;
        ppsVar6 = ppsVar6 + 2;
      } while ((vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
                *)ppsVar6 != pvVar2);
    }
  }
  return uVar5;
}

Assistant:

uint64_t get_ext_priority(opt_unchoke_candidate const& peer) const
			{
#ifndef TORRENT_DISABLE_EXTENSIONS
				if (peer.ext_priority == priority_undetermined)
				{
					peer.ext_priority = std::numeric_limits<uint64_t>::max();
					for (auto& e : plugins)
					{
						uint64_t const priority = e->get_unchoke_priority(peer_connection_handle(*peer.peer));
						peer.ext_priority = std::min(priority, peer.ext_priority);
					}
				}
				return peer.ext_priority;
#else
				TORRENT_UNUSED(peer);
				return std::numeric_limits<uint64_t>::max();
#endif
			}